

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O2

int nghttp2_http_parse_priority(nghttp2_extpri *dest,uint8_t *value,size_t valuelen)

{
  uint8_t *end;
  uint8_t uVar1;
  ssize_t sVar2;
  long lVar3;
  uint8_t *puVar4;
  uint8_t *begin;
  uint8_t *begin_00;
  nghttp2_sf_value val;
  int local_54;
  ulong local_50;
  nghttp2_sf_value local_48;
  
  end = value + valuelen;
  local_50 = (ulong)dest->urgency;
  local_54 = dest->inc;
  for (; (begin = end, valuelen != 0 && (begin = value, *value == ' ')); value = value + 1) {
    valuelen = valuelen - 1;
  }
  while (begin != end) {
    sVar2 = sf_parse_key(begin,end);
    if (sVar2 < 0) {
      return -0x1f5;
    }
    begin_00 = begin + sVar2;
    if ((begin_00 == end) || (*begin_00 != '=')) {
      local_48.type = '\0';
      local_48.field_1.b = 1;
      lVar3 = sf_parse_params(begin_00,end);
    }
    else {
      begin_00 = begin_00 + 1;
      if (begin_00 == end) {
        return -0x1f5;
      }
      if (*begin_00 == '(') {
        lVar3 = sf_parse_inner_list(&local_48,begin_00,end);
      }
      else {
        lVar3 = sf_parse_item(&local_48,begin_00,end);
      }
    }
    if (lVar3 < 0) {
      return -0x1f5;
    }
    if (sVar2 == 1) {
      if (*begin == 'u') {
        if (local_48.type != '\x01') {
          return -0x1f5;
        }
        local_50 = CONCAT44(local_48.field_1.i._4_4_,local_48.field_1.b);
        if (7 < local_50) {
          return -0x1f5;
        }
      }
      else if (*begin == 'i') {
        if (local_48.type != '\0') {
          return -0x1f5;
        }
        local_54 = local_48.field_1.b;
      }
    }
    puVar4 = begin_00 + lVar3;
    begin = begin_00 + lVar3;
    while( true ) {
      begin = begin + 1;
      if (puVar4 == end) goto LAB_0059aaa4;
      uVar1 = *puVar4;
      if ((uVar1 != '\t') && (uVar1 != ' ')) break;
      puVar4 = puVar4 + 1;
    }
    if (uVar1 != ',') {
      return -0x1f5;
    }
    while( true ) {
      if (begin == end) {
        return -0x1f5;
      }
      if ((*begin != ' ') && (*begin != '\t')) break;
      begin = begin + 1;
    }
  }
LAB_0059aaa4:
  dest->urgency = (uint32_t)local_50;
  dest->inc = local_54;
  return 0;
}

Assistant:

int nghttp2_http_parse_priority(nghttp2_extpri *dest, const uint8_t *value,
                                size_t valuelen) {
  const uint8_t *p = value, *end = value + valuelen;
  ssize_t slen;
  nghttp2_sf_value val;
  nghttp2_extpri pri = *dest;
  const uint8_t *key;
  size_t keylen;

  for (; p != end && *p == ' '; ++p)
    ;

  for (; p != end;) {
    slen = sf_parse_key(p, end);
    if (slen < 0) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }

    key = p;
    keylen = (size_t)slen;

    p += slen;

    if (p == end || *p != '=') {
      /* Boolean true */
      val.type = NGHTTP2_SF_VALUE_TYPE_BOOLEAN;
      val.b = 1;

      slen = sf_parse_params(p, end);
      if (slen < 0) {
        return NGHTTP2_ERR_INVALID_ARGUMENT;
      }
    } else if (++p == end) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    } else {
      slen = sf_parse_item_or_inner_list(&val, p, end);
      if (slen < 0) {
        return NGHTTP2_ERR_INVALID_ARGUMENT;
      }
    }

    p += slen;

    if (keylen == 1) {
      switch (key[0]) {
      case 'i':
        if (val.type != NGHTTP2_SF_VALUE_TYPE_BOOLEAN) {
          return NGHTTP2_ERR_INVALID_ARGUMENT;
        }

        pri.inc = val.b;

        break;
      case 'u':
        if (val.type != NGHTTP2_SF_VALUE_TYPE_INTEGER ||
            val.i < NGHTTP2_EXTPRI_URGENCY_HIGH ||
            NGHTTP2_EXTPRI_URGENCY_LOW < val.i) {
          return NGHTTP2_ERR_INVALID_ARGUMENT;
        }

        pri.urgency = (uint32_t)val.i;

        break;
      }
    }

    sf_discard_ows(p, end);

    if (*p++ != ',') {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }

    sf_discard_ows_end_err(p, end, NGHTTP2_ERR_INVALID_ARGUMENT);
  }

fin:
  *dest = pri;

  return 0;
}